

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PimplImpl.h
# Opt level: O1

void __thiscall
celero::Pimpl<celero::Experiment::Impl>::Pimpl<std::weak_ptr<celero::Benchmark>&>
          (Pimpl<celero::Experiment::Impl> *this,weak_ptr<celero::Benchmark> *arg1)

{
  _Atomic_word *p_Var1;
  int iVar2;
  _Head_base<0UL,_celero::Experiment::Impl_*,_false> this_00;
  weak_ptr<celero::Benchmark> local_28;
  
  this_00._M_head_impl = (Impl *)operator_new(0x90);
  local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (arg1->super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (arg1->super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count =
           (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count =
           (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
    }
  }
  Experiment::Impl::Impl(this_00._M_head_impl,&local_28);
  (this->_pimpl)._M_t.
  super___uniq_ptr_impl<celero::Experiment::Impl,_std::default_delete<celero::Experiment::Impl>_>.
  _M_t.
  super__Tuple_impl<0UL,_celero::Experiment::Impl_*,_std::default_delete<celero::Experiment::Impl>_>
  .super__Head_base<0UL,_celero::Experiment::Impl_*,_false>._M_head_impl = this_00._M_head_impl;
  if (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count;
      (local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_28.super___weak_ptr<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

Pimpl<T>::Pimpl(Arg1&& arg1) : _pimpl(new T(std::forward<Arg1>(arg1)))
	{
	}